

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_199c2b::BuildSystemFileDelegate::configureClient
          (BuildSystemFileDelegate *this,ConfigureContext *ctx,StringRef name,uint32_t version,
          property_list_type *properties)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BuildSystemDelegate *pBVar3;
  pointer ppVar4;
  BuildSystemImpl *pBVar5;
  FileSystem *pFVar6;
  int iVar7;
  FileSystem *pFVar8;
  long *plVar9;
  size_t __n;
  size_type *psVar10;
  undefined **ppuVar11;
  pointer ppVar12;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  prop;
  undefined **local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Twine local_48;
  
  __n = name.Length;
  pBVar3 = this->system->delegate;
  if (((pBVar3->name)._M_string_length != __n) ||
     (((__n != 0 && (iVar7 = bcmp(name.Data,(pBVar3->name)._M_dataplus._M_p,__n), iVar7 != 0)) ||
      (pBVar3->version != version)))) {
    return false;
  }
  ppVar12 = (properties->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (properties->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar12 == ppVar4) {
    return true;
  }
  __rhs = &local_c8.second;
  paVar1 = &local_c8.second.field_2;
  paVar2 = &local_c8.first.field_2;
  local_d0 = &PTR__DeviceAgnosticFileSystem_0020c978;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_c8,ppVar12);
    iVar7 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar7 == 0) {
      iVar7 = std::__cxx11::string::compare((char *)__rhs);
      ppuVar11 = local_d0;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare((char *)__rhs);
        ppuVar11 = &PTR__ChecksumOnlyFileSystem_0020c9d8;
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar7 != 0) {
            std::operator+(&local_68,"unsupported client file-system: \'",__rhs);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_68);
            psVar10 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_88.field_2._M_allocated_capacity = *psVar10;
              local_88.field_2._8_8_ = plVar9[3];
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            }
            else {
              local_88.field_2._M_allocated_capacity = *psVar10;
              local_88._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_88._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            llvm::Twine::Twine(&local_48,&local_88);
            llbuild::buildsystem::ConfigureContext::error(ctx,&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.second._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8.second._M_dataplus._M_p,
                              local_c8.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.first._M_dataplus._M_p == paVar2) {
              return false;
            }
            operator_delete(local_c8.first._M_dataplus._M_p,
                            local_c8.first.field_2._M_allocated_capacity + 1);
            return false;
          }
          goto LAB_0013c0b5;
        }
      }
      pBVar5 = this->system;
      pFVar8 = (FileSystem *)operator_new(0x10);
      pFVar6 = (pBVar5->fileSystem)._M_t.
               super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
               .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
      pFVar8->_vptr_FileSystem = (_func_int **)ppuVar11;
      pFVar8[1]._vptr_FileSystem = (_func_int **)pFVar6;
      (pBVar5->fileSystem)._M_t.
      super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
      .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = pFVar8;
    }
LAB_0013c0b5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.second._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.second._M_dataplus._M_p,
                      local_c8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8.first._M_dataplus._M_p,
                      local_c8.first.field_2._M_allocated_capacity + 1);
    }
    ppVar12 = ppVar12 + 1;
    if (ppVar12 == ppVar4) {
      return true;
    }
  } while( true );
}

Assistant:

bool
BuildSystemFileDelegate::configureClient(const ConfigureContext& ctx,
                                         StringRef name,
                                         uint32_t version,
                                         const property_list_type& properties) {
  // The client must match the configured name of the build system.
  if (name != getSystemDelegate().getName())
    return false;

  // The client version must match the configured version.
  //
  // FIXME: We should give the client the opportunity to support a previous
  // schema version (auto-upgrade).
  if (version != getSystemDelegate().getVersion())
    return false;

  for (auto prop : properties) {
    if (prop.first == "file-system") {
      if (prop.second == "device-agnostic") {
        system.configureFileSystem(1);
      } else if (prop.second == "checksum-only") {
        system.configureFileSystem(2);
      } else if (prop.second != "default") {
        ctx.error("unsupported client file-system: '" + prop.second + "'");
        return false;
      }
    }
  }

  return true;
}